

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void notch::core::internal::emul<float*,float*,float*>
               (float *x_begin,float *x_end,float *y_begin,float *y_end,float *z_begin,float *z_end)

{
  long lVar1;
  ostream *poVar2;
  invalid_argument *this;
  long lVar3;
  ostringstream what;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  lVar3 = (long)x_end - (long)x_begin >> 2;
  if ((lVar3 == (long)y_end - (long)y_begin >> 2) && (lVar3 == (long)z_end - (long)z_begin >> 2)) {
    if (x_end != x_begin) {
      lVar1 = 0;
      do {
        z_begin[lVar1] = x_begin[lVar1] * y_begin[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar3 + (ulong)(lVar3 == 0) != lVar1);
    }
    return;
  }
  ::std::__cxx11::ostringstream::ostringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"stl_emul: vector sizes don\'t match:\n",0x24);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," x size = ",10);
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," y size = ",10);
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," z size = ",10);
  ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::stringbuf::str();
  ::std::invalid_argument::invalid_argument(this,local_1c0);
  __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void
INTERNAL_NOBLAS(emul)(
     VectorX_Iter x_begin, VectorX_Iter x_end,
     VectorY_Iter y_begin, VectorY_Iter y_end,
     VectorZ_OutIter z_begin, VectorZ_OutIter z_end) {
    size_t x_size = std::distance(x_begin, x_end);
    size_t y_size = std::distance(y_begin, y_end);
    size_t z_size = std::distance(z_begin, z_end);
    if (x_size != y_size || x_size != z_size) {
        std::ostringstream what;
        what << "stl_emul: vector sizes don't match:\n"
            << " x size = " << x_size
            << " y size = " << y_size
            << " z size = " << z_size;
        throw std::invalid_argument(what.str());
    }
#ifdef NOTCH_USE_OPENMP
#pragma omp parallel for shared(x_begin, y_begin, z_begin, x_size)
#endif
    for (OMP_size_t i = 0; i < x_size; ++i) {
        float x_i = *(x_begin + i);
        float y_i = *(y_begin + i);
        float &z_i = *(z_begin + i);
        z_i = x_i * y_i;
    }
}